

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O1

void asl_1E(void)

{
  ubyte uVar1;
  ubyte uVar2;
  byte bVar3;
  
  except = '\0';
  uVar1 = getbyte(pc);
  uVar2 = getbyte(pc + 1);
  tempint = (ushort)x_reg + CONCAT11(uVar2,uVar1);
  bVar3 = getbyte(tempint);
  carry_f = bVar3 & 0x80;
  result_f = bVar3 * '\x02';
  putbyte(result_f,tempint);
  pc = pc + 2;
  return;
}

Assistant:

void asl_1E(void) {
    CLE;
    tempint = getbyte(pc) + 0x100 * getbyte(pc + 1) + x_reg;
    result_f = getbyte(tempint);

    carry_f = result_f & 0x80;
    result_f <<= 1;

    putbyte(result_f, tempint);
    pc += 2;
}